

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnetunix.h
# Opt level: O0

void OS_Thread::sys_thread_cleanup(void *ctx)

{
  OS_Event *this;
  __sighandler_t __handler;
  int in_ESI;
  CVmWeakRefable *in_RDI;
  OS_Event *done_evt;
  OS_Thread *t;
  
  this = (OS_Event *)in_RDI[1].weakref;
  CVmRefCntObj::add_ref((CVmRefCntObj *)0x24f9c9);
  CVmWeakRefable::release_ref(in_RDI);
  OS_Event::signal(this,in_ESI,__handler);
  CVmRefCntObj::release_ref(&in_RDI->super_CVmRefCntObj);
  return;
}

Assistant:

static void sys_thread_cleanup(void *ctx)
    {
        /* the context is the thread structure */
        OS_Thread *t = (OS_Thread *)ctx;

        /* before we release our ref on the thread, save its done event */
        OS_Event *done_evt = t->done_evt;
        done_evt->add_ref();

        /* release the thread's reference on the thread structure */
        t->release_ref();

        /* the thread has now truly exited - signal the termination event */
        done_evt->signal();
        done_evt->release_ref();
    }